

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::GLES2SharingTest::iterate(GLES2SharingTest *this)

{
  ostringstream *poVar1;
  TestLog *log;
  NativeDisplay *pNVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  deUint32 err;
  Library *egl;
  EGLDisplay pvVar6;
  NativeWindowFactory *pNVar7;
  EGLConfig config;
  undefined4 extraout_var;
  EGLSurface surface_00;
  EGLContext share;
  EGLContext context;
  char *description;
  UniqueDisplay display;
  Surface ref;
  UniqueSurface surface;
  UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> window;
  EGLint attribList [7];
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pvVar6 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  eglu::UniqueDisplay::UniqueDisplay(&display,egl,pvVar6);
  pNVar7 = eglu::selectNativeWindowFactory
                     (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  attribList[4] = 0x3021;
  attribList[5] = 1;
  attribList[6] = 0x3038;
  attribList[0] = 0x3040;
  attribList[1] = 4;
  attribList[2] = 0x3033;
  attribList[3] = 4;
  config = eglu::chooseSingleConfig(egl,display.m_display,attribList);
  pvVar6 = display.m_display;
  pNVar2 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
           super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
           ptr;
  attribList[2] =
       eglu::parseWindowVisibility
                 (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  attribList[0] = 0x1e0;
  attribList[1] = 0x1e0;
  iVar5 = (*(pNVar7->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar7,pNVar2,pvVar6,config);
  pvVar6 = display.m_display;
  window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr =
       (NativeWindow *)CONCAT44(extraout_var,iVar5);
  surface_00 = eglu::createWindowSurface
                         ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                          super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                          .m_data.ptr,
                          window.
                          super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                          .m_data.ptr,display.m_display,config,(EGLAttrib *)0x0);
  eglu::UniqueSurface::UniqueSurface(&surface,egl,pvVar6,surface_00);
  attribList._0_8_ = this->m_log;
  poVar1 = (ostringstream *)(attribList + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Create context A (share_context = EGL_NO_CONTEXT)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  share = createContext(this,display.m_display,(EGLContext)0x0,config);
  attribList._0_8_ = this->m_log;
  poVar1 = (ostringstream *)(attribList + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Create context B (share_context = context A)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  context = createContext(this,display.m_display,share,config);
  bVar3 = true;
  if ((this->m_spec).useResource == true) {
    attribList._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(attribList + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Make current context A");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    makeCurrent(this,display.m_display,share,surface.m_surface);
    attribList._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(attribList + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Creating resource");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    bVar3 = true;
    if ((this->m_spec).renderOnContexA == true) {
      attribList._0_8_ = this->m_log;
      poVar1 = (ostringstream *)(attribList + 2);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Render resource");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      if ((this->m_spec).verifyOnContexA == true) {
        tcu::Surface::Surface((Surface *)attribList,0xf0,0xf0);
        tcu::Surface::Surface(&ref,0xf0,0xf0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                  (this,attribList,&ref);
        bVar3 = tcu::fuzzyCompare(log,"Rendered image","Rendering result comparision",&ref,
                                  (Surface *)attribList,0.05,COMPARE_LOG_RESULT);
        tcu::Surface::~Surface(&ref);
        tcu::Surface::~Surface((Surface *)attribList);
      }
      else {
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this,0,0);
      }
    }
    if ((this->m_spec).renderOnContexB == true) {
      attribList._0_8_ = this->m_log;
      poVar1 = (ostringstream *)(attribList + 2);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Make current context B");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      makeCurrent(this,display.m_display,context,surface.m_surface);
      attribList._0_8_ = this->m_log;
      poVar1 = (ostringstream *)(attribList + 2);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Render resource");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      if ((this->m_spec).verifyOnContexB == true) {
        tcu::Surface::Surface((Surface *)attribList,0xf0,0xf0);
        tcu::Surface::Surface(&ref,0xf0,0xf0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                  (this,attribList,&ref);
        bVar4 = tcu::fuzzyCompare(log,"Rendered image","Rendering result comparision",&ref,
                                  (Surface *)attribList,0.05,COMPARE_LOG_RESULT);
        bVar3 = (bool)(bVar3 & bVar4);
        tcu::Surface::~Surface(&ref);
        tcu::Surface::~Surface((Surface *)attribList);
      }
      else {
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this,0,0);
      }
    }
    if ((this->m_spec).destroyOnContexB == true) {
      attribList._0_8_ = this->m_log;
      poVar1 = (ostringstream *)(attribList + 2);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Make current context B");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      makeCurrent(this,display.m_display,context,surface.m_surface);
      attribList._0_8_ = this->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(attribList + 2));
      std::operator<<((ostream *)(attribList + 2),"Destroy resource");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      attribList._0_8_ = this->m_log;
      poVar1 = (ostringstream *)(attribList + 2);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Make current context A");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      makeCurrent(this,display.m_display,share,surface.m_surface);
      attribList._0_8_ = this->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(attribList + 2));
      std::operator<<((ostream *)(attribList + 2),"Destroy resource");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(attribList + 2));
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  }
  makeCurrent(this,display.m_display,(EGLContext)0x0,(EGLSurface)0x0);
  if ((this->m_spec).destroyContextBFirst == true) {
    attribList._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(attribList + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Destroy context B");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (*egl->_vptr_Library[0x13])(egl,display.m_display,context);
    attribList._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(attribList + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Destroy context A");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (*egl->_vptr_Library[0x13])(egl,display.m_display,share);
  }
  else {
    attribList._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(attribList + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Destroy context A");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (*egl->_vptr_Library[0x13])(egl,display.m_display,share);
    attribList._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(attribList + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Destroy context B");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)attribList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (*egl->_vptr_Library[0x13])(egl,display.m_display,context);
  }
  err = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(err,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                   ,0x112);
  eglu::UniqueSurface::~UniqueSurface(&surface);
  de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::~UniqueBase
            (&window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>);
  description = "Image comparison failed";
  if (bVar3 != false) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar3 ^ 1),
             description);
  eglu::UniqueDisplay::~UniqueDisplay(&display);
  return STOP;
}

Assistant:

TestCase::IterateResult GLES2SharingTest::iterate (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	tcu::TestLog&						log				= m_testCtx.getLog();
	eglu::UniqueDisplay					display			(egl, eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay()));
	const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());
	EGLConfig							config;
	bool								isOk			= true;
	EGLContext							contextA		= EGL_NO_CONTEXT;
	EGLContext							contextB		= EGL_NO_CONTEXT;

	{
		const EGLint attribList[] =
		{
			EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
			EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
			EGL_ALPHA_SIZE,			1,
			EGL_NONE
		};

		config = eglu::chooseSingleConfig(egl, *display, attribList);
	}

	try
	{
		de::UniquePtr<eglu::NativeWindow>	window	(windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), *display, config, DE_NULL, eglu::WindowParams(480, 480, eglu::parseWindowVisibility(m_testCtx.getCommandLine()))));
		eglu::UniqueSurface					surface	(egl, *display, eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, *display, config, DE_NULL));

		m_log << tcu::TestLog::Message << "Create context A (share_context = EGL_NO_CONTEXT)" << tcu::TestLog::EndMessage;
		contextA = createContext(*display, EGL_NO_CONTEXT, config);

		m_log << tcu::TestLog::Message << "Create context B (share_context = context A)" << tcu::TestLog::EndMessage;
		contextB = createContext(*display, contextA, config);

		if (m_spec.useResource)
		{
			m_log << tcu::TestLog::Message << "Make current context A" << tcu::TestLog::EndMessage;
			makeCurrent(*display, contextA, *surface);
			m_log << tcu::TestLog::Message << "Creating resource" << tcu::TestLog::EndMessage;
			createResource();

			int		width	= 240;
			int		height	= 240;

			if (m_spec.renderOnContexA)
			{
				m_log << tcu::TestLog::Message << "Render resource" << tcu::TestLog::EndMessage;
				if (m_spec.verifyOnContexA)
				{
					tcu::Surface screen	(width, height);
					tcu::Surface ref	(width, height);
					renderResource(&screen, &ref);

					if (!fuzzyCompare(log, "Rendered image", "Rendering result comparision", ref, screen, 0.05f, tcu::COMPARE_LOG_RESULT))
						isOk = false;
				}
				else
				{
					renderResource(DE_NULL, DE_NULL);
				}
			}

			if (m_spec.renderOnContexB)
			{
				m_log << tcu::TestLog::Message << "Make current context B" << tcu::TestLog::EndMessage;
				makeCurrent(*display, contextB, *surface);
				m_log << tcu::TestLog::Message << "Render resource" << tcu::TestLog::EndMessage;
				if (m_spec.verifyOnContexB)
				{
					tcu::Surface screen	(width, height);
					tcu::Surface ref	(width, height);
					renderResource(&screen, &ref);

					if (!fuzzyCompare(log, "Rendered image", "Rendering result comparision", ref, screen, 0.05f, tcu::COMPARE_LOG_RESULT))
						isOk = false;
				}
				else
				{
					renderResource(DE_NULL, DE_NULL);
				}
			}

			if (m_spec.destroyOnContexB)
			{
				m_log << tcu::TestLog::Message << "Make current context B" << tcu::TestLog::EndMessage;
				makeCurrent(*display, contextB, *surface);
				m_log << tcu::TestLog::Message << "Destroy resource" << tcu::TestLog::EndMessage;
				destroyResource();
			}
			else
			{
				m_log << tcu::TestLog::Message << "Make current context A" << tcu::TestLog::EndMessage;
				makeCurrent(*display, contextA, *surface);
				m_log << tcu::TestLog::Message << "Destroy resource" << tcu::TestLog::EndMessage;
				destroyResource();
			}
		}

		makeCurrent(*display, EGL_NO_CONTEXT, EGL_NO_SURFACE);

		if (m_spec.destroyContextBFirst)
		{
			m_log << tcu::TestLog::Message << "Destroy context B" << tcu::TestLog::EndMessage;
			egl.destroyContext(*display, contextB);
			contextB = EGL_NO_CONTEXT;

			m_log << tcu::TestLog::Message << "Destroy context A" << tcu::TestLog::EndMessage;
			egl.destroyContext(*display, contextA);
			contextA = EGL_NO_CONTEXT;
		}
		else
		{
			m_log << tcu::TestLog::Message << "Destroy context A" << tcu::TestLog::EndMessage;
			egl.destroyContext(*display, contextA);
			contextA = EGL_NO_CONTEXT;

			m_log << tcu::TestLog::Message << "Destroy context B" << tcu::TestLog::EndMessage;
			egl.destroyContext(*display, contextB);
			contextB = EGL_NO_CONTEXT;
		}

		EGLU_CHECK(egl);
	}
	catch (...)
	{
		egl.makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
		if (contextA != EGL_NO_CONTEXT)
			egl.destroyContext(*display, contextA);
		if (contextB != EGL_NO_CONTEXT)
			egl.destroyContext(*display, contextB);
		throw;
	}

	if (isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	return STOP;
}